

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles2::Functional::getCompressedTexSubImage2DFormat
               (vector<int,_std::allocator<int>_> *supported,
               vector<int,_std::allocator<int>_> *accepted)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference __x;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator fmt;
  int i;
  vector<int,_std::allocator<int>_> *accepted_local;
  vector<int,_std::allocator<int>_> *supported_local;
  
  for (fmt._M_current._4_4_ = 0; iVar1 = fmt._M_current._4_4_,
      sVar3 = std::vector<int,_std::allocator<int>_>::size(supported), iVar1 < (int)sVar3;
      fmt._M_current._4_4_ = fmt._M_current._4_4_ + 1) {
    local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(supported);
    local_38 = (int *)std::vector<int,_std::allocator<int>_>::end(supported);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_int>
                         (local_30,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_38,
                          getCompressedTexSubImage2DFormat::compressedTexSubImage2DFormats +
                          fmt._M_current._4_4_);
    local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(supported);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_40);
    if (bVar2) {
      __x = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*(&local_28);
      std::vector<int,_std::allocator<int>_>::push_back(accepted,__x);
    }
  }
  return;
}

Assistant:

static void getCompressedTexSubImage2DFormat(const vector<deInt32>& supported, vector<deInt32>& accepted)
{
	// Find a supported compressed texture format that is accepted by compressedTexSubImage2D()

	static const GLuint compressedTexSubImage2DFormats[] =
	{
		0x83F0,	// GL_COMPRESSED_RGB_S3TC_DXT1_EXT
		0x83F1,	// GL_COMPRESSED_RGBA_S3TC_DXT1_EXT
		0x8C00,	// GL_COMPRESSED_RGB_PVRTC_4BPPV1_IMG
		0x8C01,	// GL_COMPRESSED_RGB_PVRTC_2BPPV1_IMG
		0x8C02,	// GL_COMPRESSED_RGBA_PVRTC_4BPPV1_IMG
		0x8C03	// GL_COMPRESSED_RGBA_PVRTC_2BPPV1_IMG
	};

	for (int i = 0; i < (int)supported.size(); i++)
	{
		vector<deInt32>::const_iterator fmt = std::find(supported.begin(), supported.end(), compressedTexSubImage2DFormats[i]);
		if (fmt != supported.end())
			accepted.push_back(*fmt);
	}
}